

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec3 __thiscall djb::tab::u2_to_h2_std(tab *this,vec2 *u,vec3 *wi)

{
  vec3 vVar1;
  float fVar2;
  float_t fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  float_t z_m;
  float_t tm;
  float_t pm;
  float_t u2;
  float_t u1;
  vec3 wi_std;
  int s;
  vec3 *wi_local;
  vec2 *u_local;
  tab *this_local;
  undefined4 uStack_10;
  float_t local_c;
  
  wi_std.y = 1.4013e-45;
  unique0x1000012b = wi;
  vec3::vec3((vec3 *)&u2,wi->x * 1.0,wi->y * 1.0,wi->z);
  pm = qf1(this,u->x,(vec3 *)&u2);
  tm = qf2(this,u->y,pm,(vec3 *)&u2);
  fVar2 = pm + pm;
  fVar3 = m_pi();
  fVar2 = (fVar2 + -1.0) * fVar3;
  fVar4 = sqr<float>(&tm);
  fVar3 = m_pi();
  fVar4 = fVar4 * fVar3 * 0.5;
  dVar7 = std::sin((double)(ulong)(uint)fVar4);
  fVar5 = (float)(int)wi_std.y;
  dVar8 = std::cos((double)(ulong)(uint)fVar2);
  fVar6 = (float)(int)wi_std.y;
  dVar9 = std::sin((double)(ulong)(uint)fVar2);
  dVar10 = std::cos((double)(ulong)(uint)fVar4);
  vec3::vec3((vec3 *)((long)&this_local + 4),fVar5 * SUB84(dVar7,0) * SUB84(dVar8,0),
             fVar6 * SUB84(dVar7,0) * SUB84(dVar9,0),SUB84(dVar10,0));
  vVar1.z = local_c;
  vVar1.x = (float_t)this_local._4_4_;
  vVar1.y = (float_t)uStack_10;
  return vVar1;
}

Assistant:

vec3 tab::u2_to_h2_std(const vec2 &u, const vec3 &wi) const
{
	int s = 1;//wi.y > 0 ? 1 : -1; // exploit the azimuthal symmetry of the BRDF
	vec3 wi_std = vec3(s * wi.x, s * wi.y, wi.z);
	float_t u1 = qf1(u.x, wi_std);
	float_t u2 = qf2(u.y, u1, wi_std);
	float_t pm = (2 * u1 - 1) * m_pi();
	float_t tm = sqr(u2) * m_pi() / 2;
	float_t z_m = sin(tm);

	return vec3(s * z_m * cos(pm), s * z_m * sin(pm), cos(tm));
}